

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeadNode.h
# Opt level: O2

void __thiscall
duckdb_skiplistlib::skip_list::
HeadNode<std::pair<unsigned_long,_duckdb::hugeint_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::hugeint_t>_>_>
::~HeadNode(HeadNode<std::pair<unsigned_long,_duckdb::hugeint_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::hugeint_t>_>_>
            *this)

{
  pointer pNVar1;
  Node<std::pair<unsigned_long,_duckdb::hugeint_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::hugeint_t>_>_>
  *pNVar2;
  Node<std::pair<unsigned_long,_duckdb::hugeint_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::hugeint_t>_>_>
  *pNVar3;
  
  this->_vptr_HeadNode = (_func_int **)&PTR__HeadNode_017b7c98;
  pNVar1 = (this->_nodeRefs)._nodes.
           super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::hugeint_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::hugeint_t>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::hugeint_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::hugeint_t>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->_nodeRefs)._nodes.
      super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::hugeint_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::hugeint_t>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::hugeint_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::hugeint_t>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pNVar1) {
    pNVar3 = pNVar1->pNode;
    while (pNVar3 != (Node<std::pair<unsigned_long,_duckdb::hugeint_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::hugeint_t>_>_>
                      *)0x0) {
      pNVar2 = ((pNVar3->_nodeRefs)._nodes.
                super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::hugeint_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::hugeint_t>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::hugeint_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::hugeint_t>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->pNode;
      std::
      _Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::hugeint_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::hugeint_t>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::hugeint_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::hugeint_t>_>_>_>_>
      ::~_Vector_base((_Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::hugeint_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::hugeint_t>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::hugeint_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::hugeint_t>_>_>_>_>
                       *)&pNVar3->_nodeRefs);
      operator_delete(pNVar3);
      this->_count = this->_count - 1;
      pNVar3 = pNVar2;
    }
  }
  Node<std::pair<unsigned_long,_duckdb::hugeint_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::hugeint_t>_>_>
  ::_Pool::~_Pool(&this->_pool);
  std::
  _Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::hugeint_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::hugeint_t>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::hugeint_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::hugeint_t>_>_>_>_>
  ::~_Vector_base((_Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::hugeint_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::hugeint_t>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::hugeint_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::hugeint_t>_>_>_>_>
                   *)&this->_nodeRefs);
  return;
}

Assistant:

HeadNode<T, _Compare>::~HeadNode() {
    // Hmm could this deadlock?
#ifdef SKIPLIST_THREAD_SUPPORT
    std::lock_guard<std::mutex> lock(gSkipListMutex);
#endif
    if (_nodeRefs.height()) {
        // Traverse the lowest level list iteratively deleting as we go
        // Doing this recursivley could be expensive as we are at level 0.
        const Node<T, _Compare> *node = _nodeRefs[0].pNode;
        const Node<T, _Compare> *next;
        while (node) {
            next = node->next();
            delete node;
            --_count;
            node = next;
        }
    }
    assert(_count == 0);
}